

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_heterogeneous_queue_basic_tests.cpp
# Opt level: O1

void density_tests::
     SpQueueBasicTests<(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0>::
     spinlocking_heterogeneous_queue_basic_nonpolymorphic_base_tests(void)

{
  ulong uVar1;
  bool bVar2;
  runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>
  *prVar3;
  SingleDerivedNonPoly *this;
  NonPolymorphicBase *pNVar4;
  consume_operation consume;
  SpHeterQueue<RunTimeType> queue;
  undefined1 local_120 [8];
  ControlBlock *pCStack_118;
  ulong local_110;
  LFQueue_Head<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::SpQueue_TailMultiple<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
  local_100;
  
  local_100.
  super_SpQueue_TailMultiple<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_tail = (ControlBlock *)0xffc0;
  LOCK();
  local_100.
  super_SpQueue_TailMultiple<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_mutex.m_lock.super___atomic_flag_base._M_i = (atomic_flag)(__atomic_flag_base)0x0;
  UNLOCK();
  local_100.
  super_SpQueue_TailMultiple<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>
  .m_initial_page._M_b._M_p = (__base_type)(__pointer_type)0x0;
  local_100.m_head = (ControlBlock *)0x0;
  local_120 = (undefined1  [8])0x23;
  InstanceCounted::new_instance((InstanceCounted *)(local_120 + 4));
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
  ::emplace<density_tests::NonPolymorphicBase,density_tests::NonPolymorphicBase>
            ((sp_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>
              *)&local_100,(NonPolymorphicBase *)local_120);
  NonPolymorphicBase::~NonPolymorphicBase((NonPolymorphicBase *)local_120);
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::emplace<density_tests::SingleDerivedNonPoly>
            ((sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
              *)&local_100);
  SpQueueBasicTests<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>::
  dynamic_push_3<density_tests::NonPolymorphicBase,density::sp_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>>
            ((sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
              *)&local_100);
  SpQueueBasicTests<(density::concurrency_cardinality)1,(density::concurrency_cardinality)0>::
  dynamic_push_3<density_tests::SingleDerivedNonPoly,density::sp_heter_queue<density::runtime_type<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)1,(density::concurrency_cardinality)0,density::default_busy_wait>>
            ((sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
              *)&local_100);
  do {
    local_120 = (undefined1  [8])0x0;
    pCStack_118 = (ControlBlock *)0x0;
    local_110 = 0;
    density::detail::
    LFQueue_Head<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::SpQueue_TailMultiple<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
    ::Consume::start_consume_impl((Consume *)local_120,&local_100);
    uVar1 = local_110;
    if (0xf < local_110) {
      prVar3 = density::
               sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
               ::consume_operation::complete_type((consume_operation *)local_120);
      if (prVar3->m_feature_table ==
          (tuple_type *)
          density::detail::
          FeatureTable<std::tuple<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density_tests::NonPolymorphicBase>
          ::s_table) {
        pNVar4 = density::
                 sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                 ::consume_operation::element<density_tests::NonPolymorphicBase>
                           ((consume_operation *)local_120);
        if (pNVar4->m_int != 0x23) {
          detail::assert_failed<>
                    ("m_int == 35",
                     "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/complex_polymorphism.h"
                     ,0x18);
        }
      }
      else {
        prVar3 = density::
                 sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                 ::consume_operation::complete_type((consume_operation *)local_120);
        if (prVar3->m_feature_table !=
            (tuple_type *)
            density::detail::
            FeatureTable<std::tuple<density::f_default_construct,density::f_move_construct,density::f_copy_construct,density::f_destroy,density::f_size,density::f_alignment>,density_tests::SingleDerivedNonPoly>
            ::s_table) {
          detail::assert_failed<>
                    ("consume.complete_type().template is<SingleDerivedNonPoly>()",
                     "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/sp_heterogeneous_queue_basic_tests.cpp"
                     ,0x95);
        }
        this = density::
               sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
               ::consume_operation::element<density_tests::SingleDerivedNonPoly>
                         ((consume_operation *)local_120);
        SingleDerivedNonPoly::check(this);
      }
      density::
      sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
      ::consume_operation::commit((consume_operation *)local_120);
    }
    if (0xf < local_110) {
      LOCK();
      pCStack_118->m_next = local_110 - 2;
      UNLOCK();
    }
  } while (0xf < uVar1);
  local_120 = (undefined1  [8])0x0;
  pCStack_118 = (ControlBlock *)0x0;
  local_110 = 0;
  bVar2 = density::detail::
          LFQueue_Head<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_density::detail::SpQueue_TailMultiple<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_density::default_busy_wait>_>
          ::Consume::is_queue_empty((Consume *)local_120,&local_100);
  if (!bVar2) {
    detail::assert_failed<>
              ("queue.empty()",
               "/workspace/llm4binary/github/license_c_cmakelists/giucamp[P]density/test/tests/sp_heterogeneous_queue_basic_tests.cpp"
               ,0x9b);
  }
  density::
  sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
  ::~sp_heter_queue((sp_heter_queue<density::runtime_type<density::f_default_construct,_density::f_move_construct,_density::f_copy_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::concurrency_cardinality)0,_density::default_busy_wait>
                     *)&local_100);
  return;
}

Assistant:

static void spinlocking_heterogeneous_queue_basic_nonpolymorphic_base_tests()
        {
            using namespace density;

            using RunTimeType = runtime_type<
              f_default_construct,
              f_move_construct,
              f_copy_construct,
              f_destroy,
              f_size,
              f_alignment>;
            SpHeterQueue<RunTimeType> queue;

            queue.push(NonPolymorphicBase());
            queue.template emplace<SingleDerivedNonPoly>();

            dynamic_push_3<NonPolymorphicBase>(queue);
            dynamic_push_3<SingleDerivedNonPoly>(queue);

            for (;;)
            {
                auto consume = queue.try_start_consume();
                if (!consume)
                    break;

                if (consume.complete_type().template is<NonPolymorphicBase>())
                {
                    consume.template element<NonPolymorphicBase>().check();
                }
                else
                {
                    DENSITY_TEST_ASSERT(
                      consume.complete_type().template is<SingleDerivedNonPoly>());
                    consume.template element<SingleDerivedNonPoly>().check();
                }
                consume.commit();
            }

            DENSITY_TEST_ASSERT(queue.empty());
        }